

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O1

void __thiscall
snappy::SnappyDecompressor::DecompressAllTags<snappy::SnappyIOVecWriter>
          (SnappyDecompressor *this,SnappyIOVecWriter *writer)

{
  uint *puVar1;
  byte bVar2;
  ushort uVar3;
  size_t sVar4;
  void *pvVar5;
  iovec *piVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  undefined4 extraout_var;
  ulong uVar10;
  ulong uVar11;
  uint *puVar12;
  ulong uVar13;
  ulong uVar14;
  size_t n;
  ulong local_38;
  
  puVar12 = (uint *)this->ip_;
  if ((long)this->ip_limit_ - (long)puVar12 < 5) {
    bVar7 = RefillTag(this);
    if (!bVar7) {
      return;
    }
    puVar12 = (uint *)this->ip_;
  }
LAB_0015275d:
  puVar1 = (uint *)((long)puVar12 + 1);
  bVar2 = (byte)*puVar12;
  if ((bVar2 & 3) == 0) {
    uVar14 = (ulong)(bVar2 >> 2) + 1;
    if (((bVar2 < 0x40) && (0x14 < (ulong)((long)this->ip_limit_ - (long)puVar1))) &&
       (0xf < writer->output_limit_ - writer->total_written_)) {
      sVar4 = writer->curr_iov_written_;
      if (writer->output_iov_[writer->curr_iov_index_].iov_len - sVar4 < 0x10) goto LAB_00152885;
      pvVar5 = writer->output_iov_[writer->curr_iov_index_].iov_base;
      *(undefined8 *)((long)pvVar5 + sVar4) = *(undefined8 *)((long)puVar12 + 1);
      *(undefined8 *)((long)pvVar5 + sVar4 + 8) = *(undefined8 *)((long)puVar12 + 9);
      writer->curr_iov_written_ = writer->curr_iov_written_ + uVar14;
      writer->total_written_ = writer->total_written_ + uVar14;
      if (0xef < bVar2) {
        __assert_fail("literal_length < 61",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/snappy/snappy.cc"
                      ,0x2e6,
                      "void snappy::SnappyDecompressor::DecompressAllTags(Writer *) [Writer = snappy::SnappyIOVecWriter]"
                     );
      }
      puVar12 = (uint *)((long)puVar1 + uVar14);
      cVar8 = '\x03';
    }
    else {
LAB_00152885:
      puVar12 = puVar1;
      if (0xec < bVar2) {
        uVar14 = (ulong)((*(uint *)(char_table + uVar14 * 4 + 0x110) & *puVar1) + 1);
        puVar12 = (uint *)((long)puVar1 + ((ulong)(bVar2 >> 2) - 0x3b));
      }
      uVar13 = (long)this->ip_limit_ - (long)puVar12;
      if (uVar13 < uVar14) {
        do {
          puVar1 = puVar12;
          uVar11 = uVar13;
          if (writer->output_limit_ < writer->total_written_ + uVar13) goto LAB_00152a69;
          for (; uVar11 != 0; uVar11 = uVar11 - uVar10) {
            piVar6 = writer->output_iov_;
            if (piVar6[writer->curr_iov_index_].iov_len < writer->curr_iov_written_)
            goto LAB_00152a8d;
            if (piVar6[writer->curr_iov_index_].iov_len <= writer->curr_iov_written_) {
              uVar10 = (long)writer->curr_iov_index_ + 1;
              if (writer->output_iov_count_ <= uVar10) goto LAB_00152a69;
              writer->curr_iov_written_ = 0;
              writer->curr_iov_index_ = (int)uVar10;
            }
            uVar10 = piVar6[writer->curr_iov_index_].iov_len - writer->curr_iov_written_;
            if (uVar11 <= uVar10) {
              uVar10 = uVar11;
            }
            memcpy((void *)(writer->curr_iov_written_ +
                           (long)piVar6[writer->curr_iov_index_].iov_base),puVar1,uVar10);
            writer->curr_iov_written_ = writer->curr_iov_written_ + uVar10;
            writer->total_written_ = writer->total_written_ + uVar10;
            puVar1 = (uint *)((long)puVar1 + uVar10);
          }
          (*this->reader_->_vptr_Source[4])(this->reader_,(ulong)this->peeked_);
          iVar9 = (*this->reader_->_vptr_Source[3])(this->reader_,&local_38);
          puVar12 = (uint *)CONCAT44(extraout_var,iVar9);
          this->peeked_ = (uint32)local_38;
          if (local_38 == 0) goto LAB_00152a69;
          uVar14 = uVar14 - uVar13;
          this->ip_limit_ = (char *)((long)puVar12 + local_38);
          uVar13 = local_38;
        } while (local_38 < uVar14);
      }
      cVar8 = '\x01';
      puVar1 = puVar12;
      uVar13 = uVar14;
      if (writer->total_written_ + uVar14 <= writer->output_limit_) {
        for (; uVar13 != 0; uVar13 = uVar13 - uVar11) {
          piVar6 = writer->output_iov_;
          if (piVar6[writer->curr_iov_index_].iov_len < writer->curr_iov_written_) {
LAB_00152a8d:
            __assert_fail("curr_iov_written_ <= output_iov_[curr_iov_index_].iov_len",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/snappy/snappy.cc"
                          ,0x3f8,"bool snappy::SnappyIOVecWriter::Append(const char *, size_t)");
          }
          if (piVar6[writer->curr_iov_index_].iov_len <= writer->curr_iov_written_) {
            uVar11 = (long)writer->curr_iov_index_ + 1;
            if (writer->output_iov_count_ <= uVar11) goto LAB_00152a69;
            writer->curr_iov_written_ = 0;
            writer->curr_iov_index_ = (int)uVar11;
          }
          uVar11 = piVar6[writer->curr_iov_index_].iov_len - writer->curr_iov_written_;
          if (uVar13 <= uVar11) {
            uVar11 = uVar13;
          }
          memcpy((void *)(writer->curr_iov_written_ + (long)piVar6[writer->curr_iov_index_].iov_base
                         ),puVar1,uVar11);
          writer->curr_iov_written_ = writer->curr_iov_written_ + uVar11;
          writer->total_written_ = writer->total_written_ + uVar11;
          puVar1 = (uint *)((long)puVar1 + uVar11);
        }
        puVar12 = (uint *)((long)puVar12 + uVar14);
        cVar8 = '\0';
        if ((long)this->ip_limit_ - (long)puVar12 < 5) {
          this->ip_ = (char *)puVar12;
          bVar7 = RefillTag(this);
          if (bVar7) {
            puVar12 = (uint *)this->ip_;
          }
          cVar8 = !bVar7;
        }
      }
    }
    goto LAB_00152a6e;
  }
  uVar3 = *(ushort *)(char_table + (ulong)bVar2 * 2);
  puVar12 = (uint *)((long)puVar1 + (ulong)(uVar3 >> 0xb));
  bVar7 = SnappyIOVecWriter::AppendFromSelf
                    (writer,(ulong)((uVar3 & 0x700) +
                                   (*(uint *)(wordmask + (ulong)(uVar3 >> 0xb) * 4) & *puVar1)),
                     (ulong)(uVar3 & 0xff));
  if (bVar7) {
    bVar7 = true;
    if ((long)this->ip_limit_ - (long)puVar12 < 5) {
      this->ip_ = (char *)puVar12;
      bVar7 = RefillTag(this);
      if (bVar7) {
        puVar12 = (uint *)this->ip_;
      }
    }
  }
  else {
    bVar7 = false;
  }
  cVar8 = '\x01';
  if (bVar7 != false) goto LAB_0015286a;
  goto LAB_0015286f;
LAB_00152a69:
  cVar8 = '\x01';
LAB_00152a6e:
  if (cVar8 == '\0') {
LAB_0015286a:
    cVar8 = '\0';
  }
LAB_0015286f:
  if ((cVar8 != '\0') && (cVar8 != '\x03')) {
    return;
  }
  goto LAB_0015275d;
}

Assistant:

void DecompressAllTags(Writer* writer) {
    const char* ip = ip_;

    // We could have put this refill fragment only at the beginning of the loop.
    // However, duplicating it at the end of each branch gives the compiler more
    // scope to optimize the <ip_limit_ - ip> expression based on the local
    // context, which overall increases speed.
    #define MAYBE_REFILL() \
        if (ip_limit_ - ip < kMaximumTagLength) { \
          ip_ = ip; \
          if (!RefillTag()) return; \
          ip = ip_; \
        }

    MAYBE_REFILL();
    for ( ;; ) {
      const unsigned char c = *(reinterpret_cast<const unsigned char*>(ip++));

      if ((c & 0x3) == LITERAL) {
        size_t literal_length = (c >> 2) + 1u;
        if (writer->TryFastAppend(ip, ip_limit_ - ip, literal_length)) {
          assert(literal_length < 61);
          ip += literal_length;
          // NOTE(user): There is no MAYBE_REFILL() here, as TryFastAppend()
          // will not return true unless there's already at least five spare
          // bytes in addition to the literal.
          continue;
        }
        if (PREDICT_FALSE(literal_length >= 61)) {
          // Long literal.
          const size_t literal_length_length = literal_length - 60;
          literal_length =
              (LittleEndian::Load32(ip) & wordmask[literal_length_length]) + 1;
          ip += literal_length_length;
        }

        size_t avail = ip_limit_ - ip;
        while (avail < literal_length) {
          if (!writer->Append(ip, avail)) return;
          literal_length -= avail;
          reader_->Skip(peeked_);
          size_t n;
          ip = reader_->Peek(&n);
          avail = n;
          peeked_ = avail;
          if (avail == 0) return;  // Premature end of input
          ip_limit_ = ip + avail;
        }
        if (!writer->Append(ip, literal_length)) {
          return;
        }
        ip += literal_length;
        MAYBE_REFILL();
      } else {
        const uint32 entry = char_table[c];
        const uint32 trailer = LittleEndian::Load32(ip) & wordmask[entry >> 11];
        const uint32 length = entry & 0xff;
        ip += entry >> 11;

        // copy_offset/256 is encoded in bits 8..10.  By just fetching
        // those bits, we get copy_offset (since the bit-field starts at
        // bit 8).
        const uint32 copy_offset = entry & 0x700;
        if (!writer->AppendFromSelf(copy_offset + trailer, length)) {
          return;
        }
        MAYBE_REFILL();
      }
    }

#undef MAYBE_REFILL
  }